

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_70(QPDF *pdf,char *arg2)

{
  QPDFWriter w;
  QPDFObjectHandle trailer;
  long *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40 [2];
  string local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  QPDF::getTrailer();
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/S1","");
  QPDFObjectHandle::getKey(local_30);
  QPDFObjectHandle::setFilterOnWrite(SUB81(local_30,0));
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/S2","");
  QPDFObjectHandle::getKey(local_30);
  QPDFObjectHandle::setFilterOnWrite(SUB81(local_30,0));
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  QPDFWriter::QPDFWriter((QPDFWriter *)&local_50,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(&local_50,0));
  QPDFWriter::setDecodeLevel((qpdf_stream_decode_level_e)&local_50);
  QPDFWriter::write();
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

static void
test_70(QPDF& pdf, char const* arg2)
{
    auto trailer = pdf.getTrailer();
    trailer.getKey("/S1").setFilterOnWrite(false);
    trailer.getKey("/S2").setFilterOnWrite(false);
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setDecodeLevel(qpdf_dl_specialized);
    w.write();
}